

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

void __thiscall clask::server_t::server_t(server_t *this)

{
  server_t *this_local;
  
  std::__cxx11::string::string((string *)this);
  (this->treeGET).children.super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->treeGET).children.super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->treeGET).children.super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<clask::_node,_std::allocator<clask::_node>_>::vector(&(this->treeGET).children);
  std::__cxx11::string::string((string *)&(this->treeGET).name);
  std::function<void_(clask::response_writer_&,_clask::request_&)>::function
            (&(this->treeGET).fn.f_writer);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(clask::request_&)>
  ::function(&(this->treeGET).fn.f_string);
  std::function<clask::response_(clask::request_&)>::function(&(this->treeGET).fn.f_response);
  (this->treeGET).placeholder = false;
  (this->treePOST).children.super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->treePOST).children.super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->treePOST).children.super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<clask::_node,_std::allocator<clask::_node>_>::vector(&(this->treePOST).children);
  std::__cxx11::string::string((string *)&(this->treePOST).name);
  std::function<void_(clask::response_writer_&,_clask::request_&)>::function
            (&(this->treePOST).fn.f_writer);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(clask::request_&)>
  ::function(&(this->treePOST).fn.f_string);
  std::function<clask::response_(clask::request_&)>::function(&(this->treePOST).fn.f_response);
  (this->treePOST).placeholder = false;
  logger::logger(&this->log);
  return;
}

Assistant:

server_t() : treeGET{}, treePOST{} {}